

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.h
# Opt level: O2

void __thiscall
RegVmLoweredFunction::RegVmLoweredFunction
          (RegVmLoweredFunction *this,Allocator *allocator,RegVmLoweredModule *parent,
          VmFunction *vmFunction)

{
  unsigned_short local_a;
  
  this->parent = parent;
  this->vmFunction = vmFunction;
  (this->blocks).allocator = allocator;
  (this->blocks).data = (this->blocks).little;
  (this->blocks).count = 0;
  (this->blocks).max = 0x10;
  (this->delayedFreedRegisters).allocator = allocator;
  (this->delayedFreedRegisters).data = (this->delayedFreedRegisters).little;
  (this->delayedFreedRegisters).count = 0;
  (this->delayedFreedRegisters).max = 0x10;
  (this->freedRegisters).allocator = allocator;
  (this->freedRegisters).data = (this->freedRegisters).little;
  (this->freedRegisters).count = 0;
  (this->freedRegisters).max = 0x10;
  (this->constantRegisters).allocator = allocator;
  (this->constantRegisters).data = (this->constantRegisters).little;
  (this->constantRegisters).count = 0;
  (this->constantRegisters).max = 0x10;
  (this->killedRegisters).allocator = allocator;
  (this->killedRegisters).data = (this->killedRegisters).little;
  (this->killedRegisters).count = 0;
  (this->killedRegisters).max = 0x10;
  (this->colorRegisters).allocator = allocator;
  (this->colorRegisters).data = (this->colorRegisters).little;
  (this->colorRegisters).count = 0;
  (this->colorRegisters).max = 0x10;
  local_a = 0;
  FixedArray<unsigned_short,_256U>::fill(&this->registerUsers,&local_a);
  this->nextRegister = '\x04';
  this->hasRegisterOverflow = false;
  this->registerOverflowLocation = (VmInstruction *)0x0;
  return;
}

Assistant:

RegVmLoweredFunction(Allocator *allocator, RegVmLoweredModule *parent, VmFunction *vmFunction): parent(parent), vmFunction(vmFunction), blocks(allocator), delayedFreedRegisters(allocator), freedRegisters(allocator), constantRegisters(allocator), killedRegisters(allocator), colorRegisters(allocator)
	{
		registerUsers.fill(0);

		nextRegister = rvrrCount;

		hasRegisterOverflow = false;
		registerOverflowLocation = NULL;
	}